

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O1

string * TCLAP::
         Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::shortID(string *__return_storage_ptr__,
                  Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *constraint)

{
  logic_error *this;
  
  if (constraint !=
      (Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    (*constraint->_vptr_Constraint[1])();
    return __return_storage_ptr__;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Cannot create a ValueArg with a NULL constraint");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static std::string shortID(Constraint<T> *constraint) {
		  if (!constraint)
		    throw std::logic_error("Cannot create a ValueArg with a NULL constraint");
		  return constraint->shortID();
		}